

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O1

LocalFederateId __thiscall
helics::EmptyCore::registerFederate(EmptyCore *this,string_view param_1,CoreFederateInfo *param_2)

{
  HelicsException *this_00;
  string_view message;
  char *local_38;
  size_t local_30;
  char local_28 [16];
  
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28,param_1._M_len,param_1._M_str);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Registration is not possible for Null Core","");
  message._M_str = local_38;
  message._M_len = local_30;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_004da6d8;
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

LocalFederateId EmptyCore::registerFederate(std::string_view /*name*/,
                                            const CoreFederateInfo& /*info*/)
{
    throw(RegistrationFailure(std::string("Registration is not possible for Null Core")));
}